

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_wString __thiscall ON_XMLVariant::TypeAsString(ON_XMLVariant *this)

{
  long in_RSI;
  ON_XMLVariant *this_local;
  
  switch(*(undefined4 *)(*(long *)(in_RSI + 8) + 0xa4)) {
  case 0:
  default:
    ON_wString::ON_wString((ON_wString *)this,L"null");
    break;
  case 1:
    ON_wString::ON_wString((ON_wString *)this,L"bool");
    break;
  case 2:
    ON_wString::ON_wString((ON_wString *)this,L"integer");
    break;
  case 3:
    ON_wString::ON_wString((ON_wString *)this,L"float");
    break;
  case 4:
    ON_wString::ON_wString((ON_wString *)this,L"double");
    break;
  case 5:
    ON_wString::ON_wString((ON_wString *)this,L"string");
    break;
  case 6:
    ON_wString::ON_wString((ON_wString *)this,L"2-double-array");
    break;
  case 7:
    ON_wString::ON_wString((ON_wString *)this,L"3-double-array");
    break;
  case 8:
    ON_wString::ON_wString((ON_wString *)this,L"4-double-array");
    break;
  case 9:
    ON_wString::ON_wString((ON_wString *)this,L"color");
    break;
  case 10:
    ON_wString::ON_wString((ON_wString *)this,L"matrix-4x4");
    break;
  case 0xb:
    ON_wString::ON_wString((ON_wString *)this,L"uuid");
    break;
  case 0xc:
    ON_wString::ON_wString((ON_wString *)this,L"time");
    break;
  case 0xd:
    ON_wString::ON_wString((ON_wString *)this,L"buffer");
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLVariant::TypeAsString(void) const
{
  switch (_private->_type)
  {
  case Types::Bool:         return L"bool";
  case Types::Integer:      return L"integer";
  case Types::Float:        return L"float";
  case Types::Double:       return L"double";
  case Types::DoubleArray2: return L"2-double-array";
  case Types::DoubleArray3: return L"3-double-array";
  case Types::DoubleArray4: return L"4-double-array";
  case Types::DoubleColor4: return L"color";
  case Types::Matrix:       return L"matrix-4x4";
  case Types::Uuid:         return L"uuid";
  case Types::String:       return L"string";
  case Types::Time:         return L"time";
  case Types::Buffer:       return L"buffer";
  case Types::Null:
  default:
    return L"null";
  }
}